

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

void __thiscall duckdb::MetadataManager::MarkBlocksAsModified(MetadataManager *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  const_iterator __it;
  MetadataBlock *this_00;
  __node_base_ptr p_Var3;
  idx_t iVar4;
  ulong free_list;
  mapped_type *pmVar5;
  __node_base_ptr p_Var6;
  __hash_code __code;
  _Hash_node_base *p_Var7;
  
  p_Var7 = (this->modified_blocks)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var7[1]._M_nxt;
      p_Var3 = (this->blocks)._M_h._M_buckets[(ulong)p_Var1 % (this->blocks)._M_h._M_bucket_count];
      for (p_Var6 = p_Var3->_M_nxt; p_Var1 != p_Var6[1]._M_nxt; p_Var6 = p_Var6->_M_nxt) {
        p_Var3 = p_Var6;
      }
      p_Var2 = p_Var7[2]._M_nxt;
      __it.super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>)p_Var3->_M_nxt;
      this_00 = (MetadataBlock *)
                ((long)__it.
                       super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>
                       ._M_cur + 0x10);
      iVar4 = MetadataBlock::FreeBlocksToInteger(this_00);
      free_list = iVar4 | (ulong)p_Var2;
      if (free_list == 0xffffffffffffffff) {
        ::std::
        _Hashtable<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->blocks)._M_h,__it);
        (*this->block_manager->_vptr_BlockManager[9])(this->block_manager,p_Var1);
      }
      else {
        MetadataBlock::FreeBlocksFromInteger(this_00,free_list);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->modified_blocks)._M_h);
  for (p_Var7 = (this->blocks)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
      p_Var7 = p_Var7->_M_nxt) {
    iVar4 = MetadataBlock::FreeBlocksToInteger((MetadataBlock *)(p_Var7 + 2));
    pmVar5 = ::std::__detail::
             _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->modified_blocks,(key_type *)(p_Var7 + 4));
    *pmVar5 = ~iVar4;
  }
  return;
}

Assistant:

void MetadataManager::MarkBlocksAsModified() {
	// for any blocks that were modified in the last checkpoint - set them to free blocks currently
	for (auto &kv : modified_blocks) {
		auto block_id = kv.first;
		idx_t modified_list = kv.second;
		auto entry = blocks.find(block_id);
		D_ASSERT(entry != blocks.end());
		auto &block = entry->second;
		idx_t current_free_blocks = block.FreeBlocksToInteger();
		// merge the current set of free blocks with the modified blocks
		idx_t new_free_blocks = current_free_blocks | modified_list;
		if (new_free_blocks == NumericLimits<idx_t>::Maximum()) {
			// if new free_blocks is all blocks - mark entire block as modified
			blocks.erase(entry);
			block_manager.MarkBlockAsModified(block_id);
		} else {
			// set the new set of free blocks
			block.FreeBlocksFromInteger(new_free_blocks);
		}
	}

	modified_blocks.clear();
	for (auto &kv : blocks) {
		auto &block = kv.second;
		idx_t free_list = block.FreeBlocksToInteger();
		idx_t occupied_list = ~free_list;
		modified_blocks[block.block_id] = occupied_list;
	}
}